

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

void __thiscall
duckdb::WindowQuantileState<int>::SkipListUpdater::Right
          (SkipListUpdater *this,idx_t begin,idx_t end)

{
  HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
  *this_00;
  bool bVar1;
  int *piVar2;
  idx_t local_40;
  pair<unsigned_long,_int> local_38;
  
  while (begin < end) {
    local_40 = begin;
    bVar1 = QuantileIncluded<int>::operator()(this->included,&local_40);
    if (bVar1) {
      this_00 = this->skip;
      piVar2 = QuantileCursor<int>::operator[](this->data,local_40);
      local_38.first = local_40;
      local_38.second = *piVar2;
      duckdb_skiplistlib::skip_list::
      HeadNode<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>::
      insert(this_00,&local_38);
    }
    begin = local_40 + 1;
  }
  return;
}

Assistant:

inline void Right(idx_t begin, idx_t end) {
			for (; begin < end; ++begin) {
				if (included(begin)) {
					skip.insert(SkipType(begin, data[begin]));
				}
			}
		}